

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_new(lua_State *L)

{
  CType *ct;
  CTState *cts;
  uint64_t uVar1;
  CTypeID id;
  CTInfo info;
  CTSize CVar2;
  undefined8 in_RAX;
  GCcdata *pGVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  GCtab *pGVar6;
  GCobj *o;
  TValue *o_00;
  CTSize sz;
  undefined8 uStack_38;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  uStack_38 = in_RAX;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  ct = cts->tab + id;
  info = lj_ctype_info(cts,id,(CTSize *)((long)&uStack_38 + 4));
  if ((info >> 0x14 & 1) == 0) {
    o_00 = L->base + 1;
  }
  else {
    o_00 = L->base + 2;
    CVar2 = ffi_checkint(L,2);
    CVar2 = lj_ctype_vlsize(cts,ct,CVar2);
    uStack_38 = CONCAT44(CVar2,(undefined4)uStack_38);
  }
  if (uStack_38._4_4_ == 0xffffffff) {
    lj_err_arg(L,1,LJ_ERR_FFI_INVSIZE);
  }
  pGVar3 = lj_cdata_newx(cts,id,uStack_38._4_4_,info);
  o_00[-1].u64 = (ulong)pGVar3 | 0xfffa800000000000;
  lj_cconv_ct_init(cts,ct,uStack_38._4_4_,(uint8_t *)(pGVar3 + 1),o_00,
                   (MSize)((ulong)((long)L->top - (long)o_00) >> 3));
  if ((((ct->info & 0xf0000000) == 0x10000000) &&
      (pcVar4 = lj_tab_getinth(cts->miscmap,-id), pcVar4 != (cTValue *)0x0)) &&
     ((pcVar4->field_4).it >> 0xf == 0x1fff4)) {
    pGVar6 = (GCtab *)((ulong)pcVar4->field_4 & 0x7fffffffffff);
    if ((pGVar6 == (GCtab *)0x0) || ((pGVar6->nomm & 4) != 0)) {
      pcVar4 = (cTValue *)0x0;
    }
    else {
      pcVar4 = lj_meta_cache(pGVar6,MM_gc,*(GCstr **)((L->glref).ptr64 + 0x1b8));
    }
    if ((pcVar4 != (cTValue *)0x0) && (pGVar6 = cts->finalizer, (pGVar6->metatable).gcptr64 != 0)) {
      pTVar5 = lj_tab_set(L,pGVar6,o_00 + -1);
      *pTVar5 = *pcVar4;
      if ((pGVar6->marked & 4) != 0) {
        uVar1 = (L->glref).ptr64;
        pGVar6->marked = pGVar6->marked & 0xfb;
        (pGVar6->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
        *(GCtab **)(uVar1 + 0x40) = pGVar6;
      }
      pGVar3->marked = pGVar3->marked | 0x10;
    }
  }
  L->top = o_00;
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_new)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *ct = ctype_raw(cts, id);
  CTSize sz;
  CTInfo info = lj_ctype_info(cts, id, &sz);
  TValue *o = L->base+1;
  GCcdata *cd;
  if ((info & CTF_VLA)) {
    o++;
    sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
  }
  if (sz == CTSIZE_INVALID)
    lj_err_arg(L, 1, LJ_ERR_FFI_INVSIZE);
  cd = lj_cdata_newx(cts, id, sz, info);
  setcdataV(L, o-1, cd);  /* Anchor the uninitialized cdata. */
  lj_cconv_ct_init(cts, ct, sz, cdataptr(cd),
		   o, (MSize)(L->top - o));  /* Initialize cdata. */
  if (ctype_isstruct(ct->info)) {
    /* Handle ctype __gc metamethod. Use the fast lookup here. */
    cTValue *tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
    if (tv && tvistab(tv) && (tv = lj_meta_fast(L, tabV(tv), MM_gc))) {
      GCtab *t = cts->finalizer;
      if (gcref(t->metatable)) {
	/* Add to finalizer table, if still enabled. */
	copyTV(L, lj_tab_set(L, t, o-1), tv);
	lj_gc_anybarriert(L, t);
	cd->marked |= LJ_GC_CDATA_FIN;
      }
    }
  }
  L->top = o;  /* Only return the cdata itself. */
  lj_gc_check(L);
  return 1;
}